

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_piece_util.cc
# Opt level: O3

vector<StringPiece,_std::allocator<StringPiece>_> *
SplitStringPiece(vector<StringPiece,_std::allocator<StringPiece>_> *__return_storage_ptr__,
                StringPiece input,char sep)

{
  pointer *ppSVar1;
  iterator iVar2;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  long lVar6;
  size_type __n;
  char *pcVar7;
  char *pcVar8;
  char local_41;
  StringPiece local_40;
  
  sVar5 = input.len_;
  pcVar8 = input.str_;
  (__return_storage_ptr__->super__Vector_base<StringPiece,_std::allocator<StringPiece>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<StringPiece,_std::allocator<StringPiece>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<StringPiece,_std::allocator<StringPiece>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (sVar5 == 0) {
    __n = 1;
  }
  else {
    sVar3 = 0;
    lVar6 = 0;
    do {
      lVar6 = lVar6 + (ulong)(pcVar8[sVar3] == sep);
      sVar3 = sVar3 + 1;
    } while (sVar5 != sVar3);
    __n = lVar6 + 1;
  }
  local_41 = sep;
  std::vector<StringPiece,_std::allocator<StringPiece>_>::reserve(__return_storage_ptr__,__n);
  pcVar7 = pcVar8 + sVar5;
  pcVar4 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                     (pcVar8,pcVar7,&local_41);
  if (pcVar4 != pcVar7) {
    do {
      local_40.len_ = (long)pcVar4 - (long)pcVar8;
      iVar2._M_current =
           (__return_storage_ptr__->super__Vector_base<StringPiece,_std::allocator<StringPiece>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      local_40.str_ = pcVar8;
      if (iVar2._M_current ==
          (__return_storage_ptr__->super__Vector_base<StringPiece,_std::allocator<StringPiece>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<StringPiece,_std::allocator<StringPiece>_>::_M_realloc_insert<StringPiece>
                  (__return_storage_ptr__,iVar2,&local_40);
      }
      else {
        local_40.str_._0_4_ = SUB84(pcVar8,0);
        local_40.str_._4_4_ = (undefined4)((ulong)pcVar8 >> 0x20);
        *(undefined4 *)&(iVar2._M_current)->str_ = local_40.str_._0_4_;
        *(undefined4 *)((long)&(iVar2._M_current)->str_ + 4) = local_40.str_._4_4_;
        (iVar2._M_current)->len_ = local_40.len_;
        ppSVar1 = &(__return_storage_ptr__->
                   super__Vector_base<StringPiece,_std::allocator<StringPiece>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      pcVar8 = pcVar4 + 1;
      pcVar4 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                         (pcVar8,pcVar7,&local_41);
    } while (pcVar4 != pcVar7);
  }
  local_40.len_ = (long)pcVar7 - (long)pcVar8;
  iVar2._M_current =
       (__return_storage_ptr__->super__Vector_base<StringPiece,_std::allocator<StringPiece>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (__return_storage_ptr__->super__Vector_base<StringPiece,_std::allocator<StringPiece>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_40.str_ = pcVar8;
    std::vector<StringPiece,_std::allocator<StringPiece>_>::_M_realloc_insert<StringPiece>
              (__return_storage_ptr__,iVar2,&local_40);
  }
  else {
    (iVar2._M_current)->str_ = pcVar8;
    (iVar2._M_current)->len_ = local_40.len_;
    ppSVar1 = &(__return_storage_ptr__->
               super__Vector_base<StringPiece,_std::allocator<StringPiece>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<StringPiece> SplitStringPiece(StringPiece input, char sep) {
  vector<StringPiece> elems;
  elems.reserve(count(input.begin(), input.end(), sep) + 1);

  StringPiece::const_iterator pos = input.begin();

  for (;;) {
    const char* next_pos = find(pos, input.end(), sep);
    if (next_pos == input.end()) {
      elems.push_back(StringPiece(pos, input.end() - pos));
      break;
    }
    elems.push_back(StringPiece(pos, next_pos - pos));
    pos = next_pos + 1;
  }

  return elems;
}